

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::FindLSBCase::FindLSBCase
          (FindLSBCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *name;
  DataType local_170;
  VarType local_150;
  allocator<char> local_131;
  string local_130;
  Symbol local_110;
  VarType local_d8;
  allocator<char> local_b9;
  string local_b8;
  Symbol local_98;
  DataType local_5c;
  int local_58;
  DataType intType;
  int vecSize;
  string local_48;
  ShaderType local_24;
  Precision local_20;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  TestContext *testCtx_local;
  FindLSBCase *this_local;
  
  local_24 = shaderType;
  local_20 = precision;
  shaderType_local = baseType;
  _precision_local = testCtx;
  testCtx_local = (TestContext *)this;
  shaderexecutor::(anonymous_namespace)::getIntegerFuncCaseName_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType);
  name = (char *)std::__cxx11::string::c_str();
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,testCtx,name,"findLSB",local_24);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FindLSBCase_016b6ca8;
  local_58 = glu::getDataTypeScalarSize(shaderType_local);
  if (local_58 == 1) {
    local_170 = TYPE_INT;
  }
  else {
    local_170 = glu::getDataTypeIntVec(local_58);
  }
  local_5c = local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"value",&local_b9);
  glu::VarType::VarType(&local_d8,shaderType_local,local_20);
  Symbol::Symbol(&local_98,&local_b8,&local_d8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_98);
  Symbol::~Symbol(&local_98);
  glu::VarType::~VarType(&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"lsb",&local_131);
  glu::VarType::VarType(&local_150,local_5c,PRECISION_LOWP);
  Symbol::Symbol(&local_110,&local_130,&local_150);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_IntegerFunctionCase).m_spec.outputs,&local_110);
  Symbol::~Symbol(&local_110);
  glu::VarType::~VarType(&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::operator=
            ((string *)&(this->super_IntegerFunctionCase).m_spec.source,"lsb = findLSB(value);");
  return;
}

Assistant:

FindLSBCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase	(testCtx, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "findLSB", shaderType)
	{
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	intType		= vecSize == 1 ? glu::TYPE_INT : glu::getDataTypeIntVec(vecSize);

		m_spec.inputs.push_back(Symbol("value", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("lsb", glu::VarType(intType, glu::PRECISION_LOWP)));
		m_spec.source = "lsb = findLSB(value);";
	}